

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexNoise.cpp
# Opt level: O2

float __thiscall SimplexNoise::fractal(SimplexNoise *this,size_t octaves,float x,float y)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float local_18;
  float fStack_14;
  
  fVar1 = this->mFrequency;
  fVar3 = this->mAmplitude;
  uVar2 = this->mLacunarity;
  uVar4 = this->mPersistence;
  fVar7 = 0.0;
  while (bVar5 = octaves != 0, octaves = octaves - 1, bVar5) {
    fVar6 = noise(fVar1 * x,fVar1 * y);
    fVar7 = fVar7 + fVar3 * fVar6;
    fVar1 = fVar1 * (float)uVar2;
    fVar3 = fVar3 * (float)uVar4;
  }
  return fVar7;
}

Assistant:

float SimplexNoise::fractal(size_t octaves, float x, float y) const {
    float output = 0.f;
    float frequency = mFrequency;
    float amplitude = mAmplitude;

    for (size_t i = 0; i < octaves; i++) {
        output += (amplitude * noise(x * frequency, y * frequency));

        frequency *= mLacunarity;
        amplitude *= mPersistence;
    }

    return output;
}